

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int expand_logbuf_or_invalidate(char *prefix,size_t prefix_len,size_t capacity)

{
  ptls_buffer_t *buf;
  long lVar1;
  int iVar2;
  int iVar3;
  long *in_FS_OFFSET;
  
  if (in_FS_OFFSET[-0x19] == 0) {
    iVar3 = 0;
  }
  else {
    lVar1 = *in_FS_OFFSET;
    buf = (ptls_buffer_t *)(lVar1 + -200);
    iVar3 = 0;
    iVar2 = ptls_buffer_reserve_aligned(buf,capacity + prefix_len,'\0');
    if (iVar2 == 0) {
      memcpy((void *)(in_FS_OFFSET[-0x19] + in_FS_OFFSET[-0x17]),prefix,prefix_len);
      in_FS_OFFSET[-0x17] = in_FS_OFFSET[-0x17] + prefix_len;
      iVar3 = 1;
    }
    else {
      ptls_buffer__release_memory(buf);
      *(undefined8 *)(lVar1 + -0xb8) = 0;
      *(undefined8 *)(lVar1 + -0xb0) = 0;
      buf->base = (uint8_t *)0x0;
      *(undefined8 *)(lVar1 + -0xc0) = 0;
    }
  }
  return iVar3;
}

Assistant:

static int expand_logbuf_or_invalidate(const char *prefix, size_t prefix_len, size_t capacity)
{
    if (logbuf.buf.base == NULL)
        return 0;

    if (ptls_buffer_reserve(&logbuf.buf, prefix_len + capacity) != 0) {
        ptls_buffer_dispose(&logbuf.buf);
        assert(logbuf.buf.base == NULL);
        return 0;
    }

    memcpy(logbuf.buf.base + logbuf.buf.off, prefix, prefix_len);
    logbuf.buf.off += prefix_len;

    return 1;
}